

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::TightenBoundsPS::execute
          (TightenBoundsPS *this,VectorBase<double> *x,VectorBase<double> *param_3,
          VectorBase<double> *param_4,VectorBase<double> *param_5,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double dVar1;
  VarStatus VVar2;
  bool bVar3;
  VarStatus *pVVar4;
  double *pdVar5;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar6;
  int in_stack_ffffffffffffff5c;
  VectorBase<double> *in_stack_ffffffffffffff60;
  double dVar7;
  
  pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5]);
  VVar2 = *pVVar4;
  if (VVar2 == ON_UPPER) {
    pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    dVar1 = *pdVar5;
    dVar7 = (double)in_RDI[6];
    dVar6 = (double)(**(code **)(*in_RDI + 0x30))();
    bVar3 = LT<double,double,double>(dVar1,dVar7,dVar6);
    if (bVar3) {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5])
      ;
      *pVVar4 = BASIC;
    }
  }
  else if (VVar2 == ON_LOWER) {
    pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    dVar1 = *pdVar5;
    dVar7 = (double)in_RDI[7];
    dVar6 = (double)(**(code **)(*in_RDI + 0x30))();
    bVar3 = GT<double,double,double>(dVar1,dVar7,dVar6);
    if (bVar3) {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5])
      ;
      *pVVar4 = BASIC;
    }
  }
  else if (VVar2 == FIXED) {
    pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    dVar1 = *pdVar5;
    dVar7 = (double)in_RDI[6];
    dVar6 = (double)(**(code **)(*in_RDI + 0x30))();
    bVar3 = LT<double,double,double>(dVar1,dVar7,dVar6);
    if (bVar3) {
      pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      dVar1 = *pdVar5;
      dVar7 = (double)in_RDI[7];
      dVar6 = (double)(**(code **)(*in_RDI + 0x30))();
      bVar3 = GT<double,double,double>(dVar1,dVar7,dVar6);
      if (bVar3) {
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_R9,(int)in_RDI[5]);
        *pVVar4 = BASIC;
        return;
      }
    }
    pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    dVar1 = *pdVar5;
    dVar7 = (double)in_RDI[6];
    dVar6 = (double)(**(code **)(*in_RDI + 0x30))();
    bVar3 = LT<double,double,double>(dVar1,dVar7,dVar6);
    if (bVar3) {
      pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[5])
      ;
      *pVVar4 = ON_LOWER;
    }
    else {
      pdVar5 = VectorBase<double>::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      dVar1 = *pdVar5;
      dVar7 = (double)in_RDI[7];
      dVar6 = (double)(**(code **)(*in_RDI + 0x30))();
      bVar3 = GT<double,double,double>(dVar1,dVar7,dVar6);
      if (bVar3) {
        pVVar4 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_R9,(int)in_RDI[5]);
        *pVVar4 = ON_UPPER;
      }
    }
  }
  return;
}

Assistant:

void SPxMainSM<R>::TightenBoundsPS::execute(VectorBase<R>& x, VectorBase<R>&, VectorBase<R>&,
      VectorBase<R>&,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // basis:
   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(LT(x[m_j], m_origupper, this->feastol()) && GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
      else if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;

      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(GT(x[m_j], m_origlower, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(LT(x[m_j], m_origupper, this->feastol()))
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}